

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

bool Omega_h::operator==(Read<int> *a,Read<int> *b)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  type transform;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar5 = pAVar1->size;
  }
  else {
    uVar5 = (ulong)pAVar1 >> 3;
  }
  pAVar2 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar4 = pAVar2->size;
  }
  else {
    uVar4 = (ulong)pAVar2 >> 3;
  }
  if ((int)(uVar5 >> 2) == (int)(uVar4 >> 2)) {
    if (((ulong)pAVar1 & 1) == 0) {
      uVar5 = pAVar1->size;
    }
    else {
      uVar5 = (ulong)pAVar1 >> 3;
    }
    Write<int>::Write((Write<int> *)&transform,&a->write_);
    Write<int>::Write((Write<int> *)&transform.b,&b->write_);
    bVar3 = operator==(0,uVar5 >> 2 & 0xffffffff,1,&transform);
    operator==<int>(Omega_h::Read<int>,Omega_h::Read<int>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)&transform);
    return bVar3;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0xd);
}

Assistant:

bool operator==(Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto const first = IntIterator(0);
  auto const last = IntIterator(a.size());
  auto const init = true;
  auto const op = logical_and<bool>();
  auto transform = OMEGA_H_LAMBDA(LO i)->bool { return a[i] == b[i]; };
  return transform_reduce(first, last, init, op, std::move(transform));
}